

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O1

void __thiscall
TEST_GROUP_CppUTestGroupRunIgnoredTest::~TEST_GROUP_CppUTestGroupRunIgnoredTest
          (TEST_GROUP_CppUTestGroupRunIgnoredTest *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupRunIgnoredTest_0034a000;
  TestRegistry::~TestRegistry(&this->registry);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x50);
  return;
}

Assistant:

TEST_GROUP(RunIgnoredTest)
{
    TestRegistry registry;
    RunIgnoredUtestShell *runIgnoredTest;
    DummyPluginWhichCountsThePlugins* pluginCountingPlugin;

    void setup() _override
    {
      runIgnoredTest = new RunIgnoredUtestShell("group", "test", "file", 1);
      registry.addTest(runIgnoredTest);
      pluginCountingPlugin = new DummyPluginWhichCountsThePlugins("PluginCountingPlugin", &registry);
    }
    void teardown() _override
    {
      delete pluginCountingPlugin;
      delete runIgnoredTest;
      RunIgnoredUtest::Checker = false;
    }
}